

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# member_function_pointer_kernel_1.h
# Opt level: O1

mfp_kernel_1_base_class<1UL> * __thiscall
dlib::mfp_kernel_1_base_class<1UL>::operator=
          (mfp_kernel_1_base_class<1UL> *this,mfp_kernel_1_base_class<1UL> *item)

{
  long *plVar1;
  mfp_kernel_1_base_class<1UL> local_58;
  
  local_58.mp_memory.data = &local_58;
  plVar1 = (long *)(item->mp_memory).data;
  (**(code **)(*plVar1 + 0x10))(plVar1,&local_58);
  swap(&local_58,this);
  (*(code *)**local_58.mp_memory.data)();
  return this;
}

Assistant:

mfp_kernel_1_base_class& operator= (
            const mfp_kernel_1_base_class& item
        ) { mfp_kernel_1_base_class(item).swap(*this); return *this;  }